

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw_image.cxx
# Opt level: O3

void mono16_converter(uchar *from,uchar *to,int w,int delta)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  long lVar7;
  
  iVar5 = fl_extrashift;
  iVar4 = fl_blueshift;
  iVar3 = fl_greenshift;
  iVar2 = fl_redshift;
  lVar7 = 1;
  if (dir == 1) {
    from = from + (w + -1) * delta;
    to = to + (long)w * 2 + -2;
    delta = -delta;
    lVar7 = -1;
  }
  dir = dir ^ 1;
  if (w != 0) {
    bVar1 = fl_bluemask & fl_redmask & fl_greenmask;
    do {
      ri = (uint)*from + (ri & ~(uint)bVar1);
      if (0xfe < ri) {
        ri = 0xff;
      }
      bVar6 = bVar1 & (byte)ri;
      from = from + delta;
      *(short *)to = (short)((int)(((uint)bVar6 << ((byte)iVar4 & 0x1f)) +
                                  ((uint)bVar6 << ((byte)iVar3 & 0x1f)) +
                                  ((uint)bVar6 << ((byte)iVar2 & 0x1f))) >> ((byte)iVar5 & 0x1f));
      to = to + lVar7 * 2;
      w = w + -1;
    } while (w != 0);
  }
  return;
}

Assistant:

static void mono16_converter(const uchar *from,uchar *to,int w, int delta) {
  OUTTYPE *t = (OUTTYPE *)to;
  int d, td;
  if (dir) {
    dir = 0;
    from = from+(w-1)*delta;
    t = t+(w-1)*OUTSIZE;
    d = -delta;
    td = -OUTSIZE;
  } else {
    dir = 1;
    d = delta;
    td = OUTSIZE;
  }
  uchar mask = fl_redmask & fl_greenmask & fl_bluemask;
  int r=ri;
  for (; w--; from += d, t += td) {
    r = (r&~mask) + *from; if (r > 255) r = 255;
    uchar m = r&mask;
    OUTASSIGN((
      (m<<fl_redshift)+
      (m<<fl_greenshift)+
      (m<<fl_blueshift)
      ) >> fl_extrashift);
  }
  ri = r;
}